

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  TestSuite *in_RDI;
  ostream *unaff_retaddr;
  int i;
  bool comma;
  string kIndent;
  string kTestsuites;
  TestResult *in_stack_000006e8;
  ostream *in_stack_000006f0;
  int in_stack_fffffffffffffc7c;
  UnitTest *in_stack_fffffffffffffc80;
  TestResult *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  undefined4 in_stack_fffffffffffffd5c;
  undefined1 comma_00;
  TestSuite *in_stack_fffffffffffffd60;
  TestSuite *pTVar6;
  TestResult *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  string *element_name;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int local_230;
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  string local_1e0 [8];
  TimeInMillis in_stack_fffffffffffffe28;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [16];
  undefined8 in_stack_fffffffffffffee8;
  undefined1 local_101 [40];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  string local_68 [55];
  allocator local_31;
  string local_30 [40];
  TestSuite *pTVar7;
  
  comma_00 = (undefined1)((uint)in_stack_fffffffffffffd5c >> 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"testsuites",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Indent_abi_cxx11_(CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
  std::operator<<((ostream *)in_RDI,"{\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"tests",&local_89);
  UnitTest::reportable_test_count((UnitTest *)0x1450c1);
  OutputJsonKey((ostream *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(string *)in_stack_fffffffffffffd60,
                (bool)comma_00);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"failures",&local_b1);
  UnitTest::failed_test_count((UnitTest *)0x145168);
  OutputJsonKey((ostream *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(string *)in_stack_fffffffffffffd60,
                (bool)comma_00);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"disabled",&local_d9);
  iVar3 = UnitTest::reportable_disabled_test_count((UnitTest *)0x14520f);
  OutputJsonKey((ostream *)CONCAT44(iVar3,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78,
                in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                (string *)in_stack_fffffffffffffd60,(bool)comma_00);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  element_name = (string *)local_101;
  pTVar6 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_101 + 1),"errors",(allocator *)element_name);
  OutputJsonKey((ostream *)CONCAT44(iVar3,in_stack_fffffffffffffd80),element_name,(string *)in_RDI,
                (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(string *)in_stack_fffffffffffffd60,
                (bool)comma_00);
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  pTVar7 = pTVar6;
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    in_stack_fffffffffffffd68 = (TestResult *)&local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"random_seed",(allocator *)in_stack_fffffffffffffd68);
    iVar4 = UnitTest::random_seed((UnitTest *)0x14534f);
    comma_00 = (undefined1)((uint)iVar4 >> 0x18);
    OutputJsonKey((ostream *)CONCAT44(iVar3,in_stack_fffffffffffffd80),element_name,(string *)in_RDI
                  ,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(string *)pTVar6,(bool)comma_00);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    in_stack_fffffffffffffd60 = pTVar6;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"timestamp",&local_151);
  UnitTest::start_timestamp((UnitTest *)0x1455c0);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(in_stack_fffffffffffffee8);
  OutputJsonKey((ostream *)CONCAT44(iVar3,in_stack_fffffffffffffd80),element_name,(string *)in_RDI,
                (string *)in_stack_fffffffffffffd68,(string *)in_stack_fffffffffffffd60,
                (bool)comma_00);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"time",&local_199);
  UnitTest::elapsed_time((UnitTest *)0x14568d);
  FormatTimeInMillisAsDuration_abi_cxx11_(in_stack_fffffffffffffe28);
  OutputJsonKey((ostream *)CONCAT44(iVar3,in_stack_fffffffffffffd80),element_name,(string *)in_RDI,
                (string *)in_stack_fffffffffffffd68,(string *)in_stack_fffffffffffffd60,
                (bool)comma_00);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  pTVar6 = pTVar7;
  UnitTest::ad_hoc_test_result((UnitTest *)0x145724);
  TestPropertiesAsJson(in_stack_fffffffffffffd68,(string *)in_stack_fffffffffffffd60);
  poVar5 = std::operator<<((ostream *)pTVar7,local_1e0);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"name",&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"AllTests",&local_229);
  OutputJsonKey((ostream *)CONCAT44(iVar3,in_stack_fffffffffffffd80),element_name,(string *)in_RDI,
                (string *)in_stack_fffffffffffffd68,(string *)in_stack_fffffffffffffd60,
                (bool)comma_00);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  poVar5 = std::operator<<((ostream *)pTVar6,local_68);
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,local_30);
  std::operator<<(poVar5,"\": [\n");
  bVar1 = false;
  for (local_230 = 0; iVar3 = UnitTest::total_test_suite_count((UnitTest *)0x1458f9),
      local_230 < iVar3; local_230 = local_230 + 1) {
    UnitTest::GetTestSuite(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    iVar3 = TestSuite::reportable_test_count((TestSuite *)0x145934);
    if (0 < iVar3) {
      if (bVar1) {
        std::operator<<((ostream *)pTVar6,",\n");
      }
      else {
        bVar1 = true;
      }
      UnitTest::GetTestSuite(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      PrintJsonTestSuite(unaff_retaddr,pTVar6);
    }
  }
  UnitTest::ad_hoc_test_result((UnitTest *)0x145b4f);
  bVar2 = TestResult::Failed(in_stack_fffffffffffffc88);
  if (bVar2) {
    if (bVar1) {
      std::operator<<((ostream *)pTVar6,",\n");
    }
    UnitTest::ad_hoc_test_result((UnitTest *)0x145bac);
    OutputJsonTestSuiteForTestResult(in_stack_000006f0,in_stack_000006e8);
  }
  poVar5 = std::operator<<((ostream *)pTVar6,"\n");
  poVar5 = std::operator<<(poVar5,local_68);
  poVar5 = std::operator<<(poVar5,"]\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG_GET(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    if (comma) {
      *stream << ",\n";
    }
    OutputJsonTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}